

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache_p.h
# Opt level: O0

void __thiscall QCacheItem::reset(QCacheItem *this)

{
  long lVar1;
  QNetworkCacheMetaDataPrivate *pQVar2;
  QNetworkCacheMetaData *in_RDI;
  long in_FS_OFFSET;
  QNetworkCacheMetaData *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QNetworkCacheMetaData::QNetworkCacheMetaData(in_stack_ffffffffffffffe0);
  QNetworkCacheMetaData::operator=(in_stack_ffffffffffffffe0,in_RDI);
  QNetworkCacheMetaData::~QNetworkCacheMetaData((QNetworkCacheMetaData *)0x287276);
  QBuffer::close();
  pQVar2 = in_RDI[3].d.d.ptr;
  if (pQVar2 != (QNetworkCacheMetaDataPrivate *)0x0) {
    (**(code **)(*(long *)pQVar2 + 0x20))();
  }
  in_RDI[3].d.d.ptr = (QNetworkCacheMetaDataPrivate *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void reset() {
        metaData = QNetworkCacheMetaData();
        data.close();
        delete file;
        file = nullptr;
    }